

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O3

void __thiscall nuraft::asio_service_impl::timer_handler(asio_service_impl *this,error_code err)

{
  non_const_lvalue<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>_>
  handler2;
  bool bVar1;
  unique_lock<std::mutex> lock;
  _Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>
  local_28;
  
  if ((this->continue_).super___atomic_base<int>._M_i == 1) {
    local_28._M_f = 3600000000000000;
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::expires_after(&this->asio_timer_,(duration *)&local_28);
    local_28._M_f = (offset_in_asio_service_impl_to_subr)timer_handler;
    local_28._8_8_ = 0;
    local_28._M_bound_args.
    super__Tuple_impl<0UL,_nuraft::asio_service_impl_*,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_nuraft::asio_service_impl_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_nuraft::asio_service_impl_*,_std::_Placeholder<1>_>)
         (_Tuple_impl<0UL,_nuraft::asio_service_impl_*,_std::_Placeholder<1>_>)this;
    asio::detail::
    deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
    ::
    async_wait<std::_Bind<void(nuraft::asio_service_impl::*(nuraft::asio_service_impl*,std::_Placeholder<1>))(std::error_code)>,asio::any_io_executor>
              ((deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
                *)(this->asio_timer_).impl_.service_,&(this->asio_timer_).impl_.implementation_,
               &local_28,&(this->asio_timer_).impl_.executor_);
  }
  local_28._M_f = (offset_in_asio_service_impl_to_subr)&this->stopping_lock_;
  local_28._8_8_ = local_28._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_28);
  local_28._8_1_ = 1;
  LOCK();
  bVar1 = (this->stopping_status_).super___atomic_base<unsigned_char>._M_i == '\0';
  if (bVar1) {
    (this->stopping_status_).super___atomic_base<unsigned_char>._M_i = '\x02';
  }
  UNLOCK();
  if (!bVar1) {
    std::condition_variable::notify_all();
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_28);
  return;
}

Assistant:

void asio_service_impl::timer_handler(ERROR_CODE err) {
    if (continue_.load() == 1) {
        asio_timer_.expires_after
            ( std::chrono::duration_cast<std::chrono::nanoseconds>
              ( std::chrono::hours(1000) ) );
        asio_timer_.async_wait
            ( std::bind( &asio_service_impl::timer_handler,
                         this,
                         std::placeholders::_1 ) );
    }

    uint8_t exp = 0;
    std::unique_lock<std::mutex> lock(stopping_lock_);
    if (stopping_status_.compare_exchange_strong(exp, 2)) {
        // 0 means that stop() is not waiting for CV now.
        // make it 2, to avoid stop() waits for CV.
    } else {
        stopping_cv_.notify_all();
    }
}